

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

bool __thiscall
LLVMBC::ModuleParseContext::parse_metadata_attachment_record
          (ModuleParseContext *this,BlockOrRecord *entry)

{
  size_type sVar1;
  const_reference pvVar2;
  Instruction *this_00;
  LoggingCallback p_Var3;
  void *pvVar4;
  char *__s;
  MDOperand *md;
  MDNode *node_00;
  ThreadLocalAllocator<char> local_30a9;
  basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_> local_30a8;
  char local_3088 [8];
  char buffer_2 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_2;
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  MDNode *node;
  MDOperand *operand;
  char *kind;
  size_t i;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  Instruction *inst;
  size_t num_nodes;
  size_t size;
  BlockOrRecord *entry_local;
  ModuleParseContext *this_local;
  
  if (entry->id == 0xb) {
    sVar1 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                      (&entry->ops);
    if (sVar1 == 0) {
      this_local._7_1_ = false;
    }
    else {
      sVar1 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::size
                        (&entry->ops);
      pvVar2 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
               operator[](&entry->ops,0);
      this_00 = get_instruction(this,*pvVar2);
      if (this_00 == (Instruction *)0x0) {
        p_Var3 = dxil_spv::get_thread_log_callback();
        if (p_Var3 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Invalid instruction.\n");
          fflush(_stderr);
        }
        else {
          snprintf((char *)&i,0x1000,"Invalid instruction.\n");
          pvVar4 = dxil_spv::get_thread_log_callback_userdata();
          (*p_Var3)(pvVar4,Error,(char *)&i);
        }
        this_local._7_1_ = false;
      }
      else {
        for (kind = (char *)0x0; kind < (char *)(sVar1 - 1 >> 1); kind = kind + 1) {
          pvVar2 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                   operator[](&entry->ops,(long)kind * 2 + 1);
          __s = get_metadata_kind(this,*pvVar2);
          pvVar2 = std::vector<unsigned_long,_dxil_spv::ThreadLocalAllocator<unsigned_long>_>::
                   operator[](&entry->ops,(long)kind * 2 + 2);
          md = get_metadata(this,*pvVar2);
          node_00 = dyn_cast<LLVMBC::MDNode>(md);
          if (__s == (char *)0x0) {
            p_Var3 = dxil_spv::get_thread_log_callback();
            if (p_Var3 == (LoggingCallback)0x0) {
              fprintf(_stderr,"[ERROR]: Invalid metadata kind.\n");
              fflush(_stderr);
            }
            else {
              snprintf((char *)&cb_2,0x1000,"Invalid metadata kind.\n");
              pvVar4 = dxil_spv::get_thread_log_callback_userdata();
              (*p_Var3)(pvVar4,Error,(char *)&cb_2);
            }
            return false;
          }
          if (node_00 == (MDNode *)0x0) {
            p_Var3 = dxil_spv::get_thread_log_callback();
            if (p_Var3 == (LoggingCallback)0x0) {
              fprintf(_stderr,"[ERROR]: Invalid metadata attachment.\n");
              fflush(_stderr);
            }
            else {
              snprintf(local_3088,0x1000,"Invalid metadata attachment.\n");
              pvVar4 = dxil_spv::get_thread_log_callback_userdata();
              (*p_Var3)(pvVar4,Error,local_3088);
            }
            return false;
          }
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          basic_string(&local_30a8,__s,&local_30a9);
          Instruction::setMetadata(this_00,&local_30a8,node_00);
          std::__cxx11::
          basic_string<char,_std::char_traits<char>,_dxil_spv::ThreadLocalAllocator<char>_>::
          ~basic_string(&local_30a8);
        }
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ModuleParseContext::parse_metadata_attachment_record(const BlockOrRecord &entry)
{
	if (MetaDataRecord(entry.id) != MetaDataRecord::ATTACHMENT)
		return true;

	if (entry.ops.size() < 1)
		return false;

	size_t size = entry.ops.size();
	size_t num_nodes = (size - 1) / 2;
	auto *inst = get_instruction(entry.ops[0]);

	if (!inst)
	{
		LOGE("Invalid instruction.\n");
		return false;
	}

	for (size_t i = 0; i < num_nodes; i++)
	{
		auto *kind = get_metadata_kind(entry.ops[2 * i + 1]);
		auto *operand = get_metadata(entry.ops[2 * i + 2]);
		auto *node = dyn_cast<MDNode>(operand);

		if (!kind)
		{
			LOGE("Invalid metadata kind.\n");
			return false;
		}

		if (!node)
		{
			LOGE("Invalid metadata attachment.\n");
			return false;
		}

		inst->setMetadata(kind, node);
	}
	return true;
}